

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VScaleVectorArray(N_Vector X,sunindextype param_2,int myid)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  int iVar8;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar6 = (undefined8 *)N_VCloneVectorArray(3,X);
  puVar7 = (undefined8 *)N_VCloneVectorArray(3,X);
  N_VConst(0,*puVar6);
  local_48 = 0x4000000000000000;
  dVar1 = get_time();
  iVar8 = 1;
  iVar3 = N_VScaleVectorArray(1,&local_48,puVar6,puVar6);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(1.0,(N_Vector)*puVar6,param_2);
    if (iVar3 != 0) goto LAB_001088fe;
    iVar8 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 1a ");
    }
  }
  else {
LAB_001088fe:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleVectorArray");
  }
  N_VConst(0,*puVar6);
  local_48 = 0x4000000000000000;
  dVar1 = get_time();
  iVar3 = N_VScaleVectorArray(1,&local_48,puVar6,puVar7);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(1.0,(N_Vector)*puVar7,param_2);
    if (iVar3 != 0) goto LAB_001089bb;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 1b ");
    }
  }
  else {
LAB_001089bb:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n",(ulong)(uint)myid);
    iVar8 = iVar8 + 1;
  }
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleVectorArray");
  }
  N_VConst(0,*puVar6);
  N_VConst(0,puVar6[1]);
  N_VConst(0,puVar6[2]);
  local_48 = 0x4000000000000000;
  uStack_40 = 0x3fe0000000000000;
  local_38 = 0xc000000000000000;
  dVar1 = get_time();
  iVar3 = N_VScaleVectorArray(3,&local_48,puVar6,puVar6);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(1.0,(N_Vector)*puVar6,param_2);
    iVar4 = check_ans(-1.0,(N_Vector)puVar6[1],param_2);
    iVar5 = check_ans(2.0,(N_Vector)puVar6[2],param_2);
    if (iVar5 + iVar4 + iVar3 != 0) goto LAB_00108afd;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 2a ");
    }
  }
  else {
LAB_00108afd:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n",(ulong)(uint)myid);
    iVar8 = iVar8 + 1;
  }
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleVectorArray");
  }
  N_VConst(0,*puVar6);
  N_VConst(0,puVar6[1]);
  N_VConst(0,puVar6[2]);
  local_48 = 0x4000000000000000;
  uStack_40 = 0x3fe0000000000000;
  local_38 = 0xc000000000000000;
  dVar1 = get_time();
  iVar3 = N_VScaleVectorArray(3,&local_48,puVar6,puVar7);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(1.0,(N_Vector)*puVar7,param_2);
    iVar4 = check_ans(-1.0,(N_Vector)puVar7[1],param_2);
    iVar5 = check_ans(2.0,(N_Vector)puVar7[2],param_2);
    if (iVar5 + iVar4 + iVar3 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VScaleVectorArray Case 2b ");
      }
      goto LAB_00108c50;
    }
  }
  printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n",(ulong)(uint)myid);
  iVar8 = iVar8 + 1;
LAB_00108c50:
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleVectorArray");
  }
  N_VDestroyVectorArray(puVar6,3);
  N_VDestroyVectorArray(puVar7,3);
  return iVar8;
}

Assistant:

int Test_N_VScaleVectorArray(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype c[3];
  N_Vector *Y, *Z;

  /* create vectors for testing */
  Y = N_VCloneVectorArray(3, X);
  Z = N_VCloneVectorArray(3, X);

  /*
   * Case 1a: Y[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(1, c, Y, Y);
  sync_device(X);
  stop_time = get_time();

  /* Y[0] should be a vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 1b: Z[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(1, c, Y, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[0] should be a vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2a: Y[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(3, c, Y, Y);
  sync_device(X);
  stop_time = get_time();

  /* Y[i] should be a vector of +1, -1, 2 */
  if (ierr == 0)
  {
    failure = check_ans(ONE, Y[0], local_length);
    failure += check_ans(NEG_ONE, Y[1], local_length);
    failure += check_ans(TWO, Y[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2b: Z[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(3, c, Y, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[i] should be a vector of +1, -1, 2 */
  if (ierr == 0)
  {
    failure = check_ans(ONE, Z[0], local_length);
    failure += check_ans(NEG_ONE, Z[1], local_length);
    failure += check_ans(TWO, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Y, 3);
  N_VDestroyVectorArray(Z, 3);

  return (fails);
}